

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void stone_close_handler(CManager_conflict cm,CMConnection conn,void *client_data)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  CManager cm_00;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  timespec ts_2;
  proto_action *act;
  timespec ts_1;
  timespec ts;
  EVStoneCloseHandlerFunc handler;
  stone_type stone;
  int a;
  int s;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffff58;
  CMConnection in_stack_ffffffffffffff70;
  int line;
  char *in_stack_ffffffffffffff78;
  CManager in_stack_ffffffffffffff80;
  __time_t local_70;
  undefined4 local_68;
  CMTraceType in_stack_ffffffffffffff9c;
  CManager in_stack_ffffffffffffffa0;
  timespec local_58;
  timespec local_48;
  code *local_38;
  stone_type local_30;
  int local_28;
  uint local_24;
  long local_20;
  long local_10;
  long local_8;
  
  local_20 = *(long *)(in_RDI + 0x118);
  local_28 = 0;
  local_38 = (code *)0x0;
  local_24 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  IntCManager_lock(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  local_30 = stone_struct(in_stack_ffffffffffffff58,0);
  if (local_30 == (stone_type)0x0) {
    iVar1 = CMtrace_val[10];
    if (*(long *)(local_8 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    line = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffff80 = *(CManager *)(local_8 + 0x120);
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf((FILE *)in_stack_ffffffffffffff80,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf(*(FILE **)(local_8 + 0x120),
              "Got a close for connection %p on already free\'d stone %x, shutting down\n",local_10,
              (ulong)local_24);
    }
    fflush(*(FILE **)(local_8 + 0x120));
    IntCManager_unlock(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,line);
    return;
  }
  iVar1 = CMtrace_val[10];
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffff70 = *(CMConnection *)(local_8 + 0x120);
      _Var2 = getpid();
      in_stack_ffffffffffffff78 = (char *)(long)_Var2;
      pVar3 = pthread_self();
      fprintf((FILE *)in_stack_ffffffffffffff70,"P%lxT%lx - ",in_stack_ffffffffffffff78,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_58);
      fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
    }
    fprintf(*(FILE **)(local_8 + 0x120),"Got a close for connection %p on stone %x, shutting down\n"
            ,local_10,(ulong)local_24);
  }
  fflush(*(FILE **)(local_8 + 0x120));
  for (local_28 = 0; local_28 < local_30->proto_action_count; local_28 = local_28 + 1) {
    cm_00 = (CManager)(local_30->proto_actions + local_28);
    if ((*(int *)&cm_00->transports == 1) && (*(long *)&cm_00->CManager_ID == local_10)) {
      *(undefined4 *)&cm_00->in_formats = 1;
      *(undefined8 *)&cm_00->CManager_ID = 0;
      iVar1 = CMtrace_val[7];
      if (*(long *)(local_8 + 0x120) == 0) {
        iVar1 = CMtrace_init(cm_00,in_stack_ffffffffffffff9c);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          __stream = *(FILE **)(local_8 + 0x120);
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&local_70);
          fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_70,
                  CONCAT44(in_stack_ffffffffffffff9c,local_68));
        }
        fprintf(*(FILE **)(local_8 + 0x120),"Closing and dereferencing conn %p\n",local_10);
      }
      fflush(*(FILE **)(local_8 + 0x120));
      INT_CMConnection_close(in_stack_ffffffffffffff70);
      if (*(long *)(local_20 + 0xb0) != 0) {
        local_38 = *(code **)(local_20 + 0xb0);
      }
    }
  }
  IntCManager_unlock(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (local_38 == (code *)0x0) {
    return;
  }
  (*local_38)(local_8,local_10,local_24,*(undefined8 *)(local_20 + 0xb8));
  return;
}

Assistant:

static void
stone_close_handler(CManager cm, CMConnection conn, void *client_data)
{
    event_path_data evp = cm->evp;
    int s = (int)(intptr_t)client_data;  /* stone ID */
    int a = 0;
    stone_type stone;
    EVStoneCloseHandlerFunc handler = NULL;
    CManager_lock(cm);
    stone = stone_struct(evp, s);
    if (!stone) {
	CMtrace_out(cm, EVerbose, "Got a close for connection %p on already free'd stone %x, shutting down\n",
		    conn, s);
	CManager_unlock(cm);
	return;
    }
    CMtrace_out(cm, EVerbose, "Got a close for connection %p on stone %x, shutting down\n",
		conn, s);
    for (a=0 ; a < stone->proto_action_count; a++) {
	proto_action *act = &stone->proto_actions[a];
	if ((act->action_type == Action_Bridge) && 
	    (act->o.bri.conn == conn)) {
	    act->o.bri.conn_failed = 1;
	    act->o.bri.conn = NULL;
	    CMtrace_out(cm, CMFreeVerbose, "Closing and dereferencing conn %p\n", conn);
	    INT_CMConnection_close(conn);   /* dereference the connection */
/*	    while (act->queue->queue_head != NULL) {
		int action_id;
		event_item *event = dequeue_event(cm, act->queue, &action_id);
		return_event(evp, event);
		}*/
	    if (evp->app_stone_close_handler) {
	        handler = evp->app_stone_close_handler;
	    }
	}
    }
    CManager_unlock(cm);
    if (handler) handler(cm, conn, s, evp->app_stone_close_data);
}